

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

void __thiscall spvtools::opt::analysis::TypeManager::AnalyzeTypes(TypeManager *this,Module *module)

{
  Instruction *pIVar1;
  __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
  _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Kind KVar6;
  int iVar7;
  uint32_t uVar8;
  mapped_type *ppIVar9;
  reference ppIVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pUVar11;
  pointer pUVar12;
  mapped_type *ppTVar13;
  Type *pTVar14;
  undefined4 extraout_var_01;
  IRContext *this_00;
  DecorationManager *this_01;
  reference ppIVar15;
  unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
  *__x;
  pointer puVar16;
  mapped_type *pmVar17;
  reference __k;
  reference this_02;
  reference this_03;
  pointer pTVar18;
  pointer that;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>,_bool>
  pVar19;
  Type *tj;
  Type *ti;
  unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_> *j;
  iterator __end3;
  iterator __begin3;
  TypePool *__range3;
  unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_> *i;
  iterator __end2_7;
  iterator __begin2_7;
  TypePool *__range2_7;
  pair<const_unsigned_int,_spvtools::opt::analysis::Type_*> *type_4;
  iterator __end2_6;
  iterator __begin2_6;
  IdToTypeMap *__range2_6;
  pointer local_1d8;
  uint32_t local_1cc;
  _Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
  local_1c8;
  undefined1 local_1c0;
  _Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
  local_1b8;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>,_bool>
  pair;
  Instruction *dec;
  iterator __end4;
  iterator __begin4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decorations;
  UnresolvedType *type_3;
  iterator __end2_5;
  iterator __begin2_5;
  IdToUnresolvedType *__range2_5;
  Type *local_148;
  Type *type2;
  iterator iStack_138;
  uint32_t id2;
  __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
  local_130;
  __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
  it2;
  Type *type1;
  iterator iStack_118;
  uint32_t id1;
  __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
  local_110;
  iterator it1;
  bool restart;
  UnresolvedType *type_2;
  iterator __end2_4;
  iterator __begin2_4;
  IdToUnresolvedType *__range2_4;
  UnresolvedType *type_1;
  iterator __end2_3;
  iterator __begin2_3;
  IdToUnresolvedType *__range2_3;
  Pointer *p;
  Type *t;
  UnresolvedType *type;
  iterator __end2_2;
  iterator __begin2_2;
  IdToUnresolvedType *__range2_2;
  Instruction *inst_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  *__range2_1;
  Instruction *local_50;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  *__range2;
  Module *module_local;
  TypeManager *this_local;
  
  Module::GetConstants
            ((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
              *)&__begin2,module);
  __end2 = std::
           vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
           ::begin((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                    *)&__begin2);
  inst = (Instruction *)
         std::
         vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
         ::end((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                *)&__begin2);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_spvtools::opt::Instruction_**,_std::vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>_>
                                     *)&inst), bVar3) {
    ppIVar10 = __gnu_cxx::
               __normal_iterator<const_spvtools::opt::Instruction_**,_std::vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>_>
               ::operator*(&__end2);
    pIVar1 = *ppIVar10;
    local_50 = pIVar1;
    __range2_1._4_4_ = opt::Instruction::result_id(pIVar1);
    ppIVar9 = std::
              unordered_map<unsigned_int,_const_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>_>
              ::operator[](&this->id_to_constant_inst_,(key_type *)((long)&__range2_1 + 4));
    *ppIVar9 = pIVar1;
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::Instruction_**,_std::vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>::
  ~vector((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
           *)&__begin2);
  Module::GetTypes((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                    *)&__begin2_1,module);
  __end2_1 = std::
             vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
             ::begin((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                      *)&__begin2_1);
  inst_1 = (Instruction *)
           std::
           vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
           ::end((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                  *)&__begin2_1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_spvtools::opt::Instruction_**,_std::vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>_>
                             *)&inst_1), bVar3) {
    ppIVar10 = __gnu_cxx::
               __normal_iterator<const_spvtools::opt::Instruction_**,_std::vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>_>
               ::operator*(&__end2_1);
    RecordIfTypeDefinition(this,*ppIVar10);
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::Instruction_**,_std::vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2_1);
  }
  std::
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>::
  ~vector((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
           *)&__begin2_1);
  bVar3 = std::
          vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
          ::empty(&this->incomplete_types_);
  if (!bVar3) {
    __end2_2 = std::
               vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
               ::begin(&this->incomplete_types_);
    type = (UnresolvedType *)
           std::
           vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
           ::end(&this->incomplete_types_);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                               *)&type), bVar3) {
      pUVar11 = __gnu_cxx::
                __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                ::operator*(&__end2_2);
      pTVar14 = UnresolvedType::type(pUVar11);
      KVar6 = analysis::Type::kind(pTVar14);
      if (KVar6 == kForwardPointer) {
        uVar8 = UnresolvedType::id(pUVar11);
        pTVar14 = GetType(this,uVar8);
        if (pTVar14 == (Type *)0x0) {
          __assert_fail("t",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                        ,0x5a,
                        "void spvtools::opt::analysis::TypeManager::AnalyzeTypes(const Module &)");
        }
        iVar7 = (*pTVar14->_vptr_Type[0x21])();
        if ((Pointer *)CONCAT44(extraout_var,iVar7) == (Pointer *)0x0) {
          __assert_fail("p",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                        ,0x5c,
                        "void spvtools::opt::analysis::TypeManager::AnalyzeTypes(const Module &)");
        }
        pTVar14 = UnresolvedType::type(pUVar11);
        iVar5 = (*pTVar14->_vptr_Type[0x2f])();
        ForwardPointer::SetTargetPointer
                  ((ForwardPointer *)CONCAT44(extraout_var_00,iVar5),
                   (Pointer *)CONCAT44(extraout_var,iVar7));
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
      ::operator++(&__end2_2);
    }
    __end2_3 = std::
               vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
               ::begin(&this->incomplete_types_);
    type_1 = (UnresolvedType *)
             std::
             vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
             ::end(&this->incomplete_types_);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                               *)&type_1), bVar3) {
      pUVar11 = __gnu_cxx::
                __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                ::operator*(&__end2_3);
      pTVar14 = UnresolvedType::type(pUVar11);
      ReplaceForwardPointers(this,pTVar14);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
      ::operator++(&__end2_3);
    }
    __end2_4 = std::
               vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
               ::begin(&this->incomplete_types_);
    type_2 = (UnresolvedType *)
             std::
             vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
             ::end(&this->incomplete_types_);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                               *)&type_2), bVar3) {
      pUVar11 = __gnu_cxx::
                __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                ::operator*(&__end2_4);
      pTVar14 = UnresolvedType::type(pUVar11);
      KVar6 = analysis::Type::kind(pTVar14);
      if (KVar6 == kForwardPointer) {
        UnresolvedType::ResetType(pUVar11,(Type *)0x0);
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
      ::operator++(&__end2_4);
    }
    it1._M_current._7_1_ = 1;
    while ((it1._M_current._7_1_ & 1) != 0) {
      it1._M_current._7_1_ = 0;
      local_110._M_current =
           (UnresolvedType *)
           std::
           vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
           ::begin(&this->incomplete_types_);
      while( true ) {
        iStack_118 = std::
                     vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                     ::end(&this->incomplete_types_);
        bVar3 = __gnu_cxx::operator!=(&local_110,&stack0xfffffffffffffee8);
        if (!bVar3) break;
        pUVar12 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                  ::operator->(&local_110);
        UnresolvedType::id(pUVar12);
        pUVar12 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                  ::operator->(&local_110);
        it2._M_current = (UnresolvedType *)UnresolvedType::type(pUVar12);
        if ((Type *)it2._M_current != (Type *)0x0) {
          local_130 = __gnu_cxx::
                      __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                      ::operator+(&local_110,1);
          while( true ) {
            iStack_138 = std::
                         vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                         ::end(&this->incomplete_types_);
            bVar3 = __gnu_cxx::operator!=(&local_130,&stack0xfffffffffffffec8);
            if (!bVar3) break;
            pUVar12 = __gnu_cxx::
                      __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                      ::operator->(&local_130);
            type2._4_4_ = UnresolvedType::id(pUVar12);
            pUVar12 = __gnu_cxx::
                      __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                      ::operator->(&local_130);
            local_148 = UnresolvedType::type(pUVar12);
            if ((local_148 != (Type *)0x0) &&
               (bVar3 = analysis::Type::IsSame((Type *)it2._M_current,local_148), bVar3)) {
              ReplaceType(this,(Type *)it2._M_current,local_148);
              pUVar12 = __gnu_cxx::
                        __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                        ::operator->(&local_130);
              UnresolvedType::ResetType(pUVar12,(Type *)0x0);
              _Var2 = it2;
              pUVar12 = __gnu_cxx::
                        __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                        ::operator->(&local_130);
              __range2_5._4_4_ = UnresolvedType::id(pUVar12);
              ppTVar13 = std::
                         unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                         ::operator[](&this->id_to_incomplete_type_,
                                      (key_type *)((long)&__range2_5 + 4));
              *ppTVar13 = (mapped_type)_Var2._M_current;
              it1._M_current._7_1_ = 1;
            }
            __gnu_cxx::
            __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
            ::operator++(&local_130);
          }
        }
        __gnu_cxx::
        __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
        ::operator++(&local_110);
      }
    }
    __end2_5 = std::
               vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
               ::begin(&this->incomplete_types_);
    type_3 = (UnresolvedType *)
             std::
             vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
             ::end(&this->incomplete_types_);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                               *)&type_3), bVar3) {
      decorations.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
                    ::operator*(&__end2_5);
      pTVar14 = UnresolvedType::type
                          ((UnresolvedType *)
                           decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (pTVar14 != (Type *)0x0) {
        pTVar14 = UnresolvedType::type
                            ((UnresolvedType *)
                             decorations.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar7 = (*pTVar14->_vptr_Type[0x2f])();
        if (CONCAT44(extraout_var_01,iVar7) == 0) {
          this_00 = context(this);
          this_01 = IRContext::get_decoration_mgr(this_00);
          uVar8 = UnresolvedType::id((UnresolvedType *)
                                     decorations.
                                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          DecorationManager::GetDecorationsFor
                    ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&__range4,this_01,uVar8,true);
          __end4 = std::
                   vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            *)&__range4);
          dec = (Instruction *)
                std::
                vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)&__range4);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                             *)&dec), bVar3) {
            ppIVar15 = __gnu_cxx::
                       __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                       ::operator*(&__end4);
            pIVar1 = *ppIVar15;
            pair._8_8_ = pIVar1;
            pTVar14 = UnresolvedType::type
                                ((UnresolvedType *)
                                 decorations.
                                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            AttachDecoration(this,pIVar1,pTVar14);
            __gnu_cxx::
            __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            ::operator++(&__end4);
          }
          __x = UnresolvedType::ReleaseType
                          ((UnresolvedType *)
                           decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pVar19 = std::
                   unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
                   ::insert(&this->type_pool_,__x);
          local_1c8._M_cur =
               (__node_type *)
               pVar19.first.
               super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
               ._M_cur;
          local_1c0 = pVar19.second;
          local_1b8._M_cur = local_1c8._M_cur;
          pair.first.
          super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
          ._M_cur._0_1_ = local_1c0;
          puVar16 = std::__detail::
                    _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                    ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                                  *)&local_1b8);
          pTVar18 = std::
                    unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                    ::get(puVar16);
          local_1cc = UnresolvedType::id((UnresolvedType *)
                                         decorations.
                                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ppTVar13 = std::
                     unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                     ::operator[](&this->id_to_type_,&local_1cc);
          *ppTVar13 = pTVar18;
          uVar8 = UnresolvedType::id((UnresolvedType *)
                                     decorations.
                                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          puVar16 = std::__detail::
                    _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                    ::operator->((_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                                  *)&local_1b8);
          local_1d8 = std::
                      unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                      ::get(puVar16);
          pmVar17 = std::
                    unordered_map<const_spvtools::opt::analysis::Type_*,_unsigned_int,_spvtools::opt::analysis::HashTypePointer,_spvtools::opt::analysis::CompareTypePointers,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>_>
                    ::operator[](&this->type_to_id_,&local_1d8);
          *pmVar17 = uVar8;
          __range2_6._4_4_ =
               UnresolvedType::id((UnresolvedType *)
                                  decorations.
                                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
          ::erase(&this->id_to_incomplete_type_,(key_type *)((long)&__range2_6 + 4));
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&__range4);
        }
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::analysis::TypeManager::UnresolvedType_*,_std::vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>_>
      ::operator++(&__end2_5);
    }
    __end2_6 = std::
               unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
               ::begin(&this->id_to_incomplete_type_);
    type_4 = (pair<const_unsigned_int,_spvtools::opt::analysis::Type_*> *)
             std::
             unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
             ::end(&this->id_to_incomplete_type_);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_6.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
                                *)&type_4), bVar3) {
      __k = std::__detail::
            _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false,_false>
            ::operator*(&__end2_6);
      pTVar14 = __k->second;
      ppTVar13 = std::
                 unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
                 ::operator[](&this->id_to_type_,&__k->first);
      *ppTVar13 = pTVar14;
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false,_false>::
      operator++(&__end2_6);
    }
    __end2_7 = std::
               unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
               ::begin(&this->type_pool_);
    i = (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
         *)std::
           unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
           ::end(&this->type_pool_);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_7.
                               super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                              ,(_Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                                *)&i), bVar3) {
      this_02 = std::__detail::
                _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                ::operator*(&__end2_7);
      __end3 = std::
               unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
               ::begin(&this->type_pool_);
      j = (unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           *)std::
             unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
             ::end(&this->type_pool_);
      while (bVar3 = std::__detail::operator!=
                               (&__end3.
                                 super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                                ,(_Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                                  *)&j), bVar3) {
        this_03 = std::__detail::
                  _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
                  ::operator*(&__end3);
        pTVar18 = std::
                  unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                  ::get(this_02);
        that = std::
               unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
               ::get(this_03);
        if (pTVar18 == that) {
LAB_008b9dfd:
          bVar3 = true;
        }
        else {
          bVar4 = analysis::Type::IsSame(pTVar18,that);
          bVar3 = false;
          if (!bVar4) goto LAB_008b9dfd;
        }
        if (!bVar3) {
          __assert_fail("(ti == tj || !ti->IsSame(tj)) && \"Type pool contains two types that are the same.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                        ,0xac,
                        "void spvtools::opt::analysis::TypeManager::AnalyzeTypes(const Module &)");
        }
        std::__detail::
        _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
        ::operator++(&__end3);
      }
      std::__detail::
      _Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>
      ::operator++(&__end2_7);
    }
  }
  return;
}

Assistant:

void TypeManager::AnalyzeTypes(const Module& module) {
  // First pass through the constants, as some will be needed when traversing
  // the types in the next pass.
  for (const auto* inst : module.GetConstants()) {
    id_to_constant_inst_[inst->result_id()] = inst;
  }

  // Then pass through the types.  Any types that reference a forward pointer
  // (directly or indirectly) are incomplete, and are added to incomplete types.
  for (const auto* inst : module.GetTypes()) {
    RecordIfTypeDefinition(*inst);
  }

  if (incomplete_types_.empty()) {
    return;
  }

  // Get the real pointer definition for all of the forward pointers.
  for (auto& type : incomplete_types_) {
    if (type.type()->kind() == Type::kForwardPointer) {
      auto* t = GetType(type.id());
      assert(t);
      auto* p = t->AsPointer();
      assert(p);
      type.type()->AsForwardPointer()->SetTargetPointer(p);
    }
  }

  // Replaces the references to the forward pointers in the incomplete types.
  for (auto& type : incomplete_types_) {
    ReplaceForwardPointers(type.type());
  }

  // Delete the forward pointers now that they are not referenced anymore.
  for (auto& type : incomplete_types_) {
    if (type.type()->kind() == Type::kForwardPointer) {
      type.ResetType(nullptr);
    }
  }

  // Compare the complete types looking for types that are the same.  If there
  // are two types that are the same, then replace one with the other.
  // Continue until we reach a fixed point.
  bool restart = true;
  while (restart) {
    restart = false;
    for (auto it1 = incomplete_types_.begin(); it1 != incomplete_types_.end();
         ++it1) {
      uint32_t id1 = it1->id();
      Type* type1 = it1->type();
      if (!type1) {
        continue;
      }

      for (auto it2 = it1 + 1; it2 != incomplete_types_.end(); ++it2) {
        uint32_t id2 = it2->id();
        (void)(id2 + id1);
        Type* type2 = it2->type();
        if (!type2) {
          continue;
        }

        if (type1->IsSame(type2)) {
          ReplaceType(type1, type2);
          it2->ResetType(nullptr);
          id_to_incomplete_type_[it2->id()] = type1;
          restart = true;
        }
      }
    }
  }

  // Add the remaining incomplete types to the type pool.
  for (auto& type : incomplete_types_) {
    if (type.type() && !type.type()->AsForwardPointer()) {
      std::vector<Instruction*> decorations =
          context()->get_decoration_mgr()->GetDecorationsFor(type.id(), true);
      for (auto dec : decorations) {
        AttachDecoration(*dec, type.type());
      }
      auto pair = type_pool_.insert(type.ReleaseType());
      id_to_type_[type.id()] = pair.first->get();
      type_to_id_[pair.first->get()] = type.id();
      id_to_incomplete_type_.erase(type.id());
    }
  }

  // Add a mapping for any ids that whose original type was replaced by an
  // equivalent type.
  for (auto& type : id_to_incomplete_type_) {
    id_to_type_[type.first] = type.second;
  }

#ifndef NDEBUG
  // Check if the type pool contains two types that are the same.  This
  // is an indication that the hashing and comparison are wrong.  It
  // will cause a problem if the type pool gets resized and everything
  // is rehashed.
  for (auto& i : type_pool_) {
    for (auto& j : type_pool_) {
      Type* ti = i.get();
      Type* tj = j.get();
      assert((ti == tj || !ti->IsSame(tj)) &&
             "Type pool contains two types that are the same.");
    }
  }
#endif
}